

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_light.cpp
# Opt level: O3

Vector3D * __thiscall
CGL::SceneObjects::EnvironmentLight::sample_dir
          (Vector3D *__return_storage_ptr__,EnvironmentLight *this,Ray *r)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector2D local_28;
  
  auVar1 = *(undefined1 (*) [16])(r->d).field_0.field_2.__vec;
  dVar4 = (r->d).field_0.field_0.z;
  auVar5 = vdppd_avx(auVar1,auVar1,0x31);
  dVar7 = dVar4 * dVar4 + auVar5._0_8_;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar7;
    auVar5 = vsqrtsd_avx(auVar5,auVar5);
    dVar7 = auVar5._0_8_;
  }
  dVar7 = 1.0 / dVar7;
  auVar5 = vshufpd_avx(auVar1,auVar1,1);
  dVar3 = acos(auVar5._0_8_ * dVar7);
  dVar4 = atan2(-dVar7 * dVar4,auVar1._0_8_ * dVar7);
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_8_ = dVar3;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (dVar4 + 3.141592653589793) * 0.5;
  auVar1 = vunpcklpd_avx(auVar6,auVar2);
  auVar8._8_8_ = 0x400921fb54442d18;
  auVar8._0_8_ = 0x400921fb54442d18;
  auVar5 = vdivpd_avx(auVar1,auVar8);
  auVar1._0_8_ = this->envMap->w;
  auVar1._8_8_ = this->envMap->h;
  auVar1 = vblendps_avx(ZEXT816(0),auVar1,5);
  auVar9._8_8_ = 0x4330000000000000;
  auVar9._0_8_ = 0x4330000000000000;
  auVar1 = vorps_avx(auVar1,auVar9);
  auVar1 = vsubpd_avx(auVar1,auVar9);
  local_28.x = auVar5._0_8_ * auVar1._0_8_;
  local_28.y = auVar5._8_8_ * auVar1._8_8_;
  bilerp(__return_storage_ptr__,this,&local_28);
  return __return_storage_ptr__;
}

Assistant:

Vector3D EnvironmentLight::sample_dir(const Ray& r) const {
    // TODO: 3-2 Part 3 Task 1
    // Use the helper functions to convert r.d into (x,y)
    // then bilerp the return value

    Vector2D theta_phi = dir_to_theta_phi(r.d);
    Vector2D xy = theta_phi_to_xy(theta_phi);

    return bilerp(xy);
  }